

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

SerializationCompatibility * duckdb::SerializationCompatibility::Latest(void)

{
  SerializationCompatibility *in_RDI;
  SerializationCompatibility *res;
  string *in_stack_000000b8;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"latest",&local_31);
  FromString(in_stack_000000b8);
  ::std::__cxx11::string::~string(local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  in_RDI->manually_set = false;
  return in_RDI;
}

Assistant:

SerializationCompatibility SerializationCompatibility::Latest() {
	auto res = FromString("latest");
	res.manually_set = false;
	return res;
}